

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::init
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
           *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  deUint64 *pdVar2;
  int *piVar3;
  pointer __src;
  int iVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  ulong uVar6;
  pointer __dest;
  NotSupportedError *this_00;
  long *plVar7;
  ulong uVar8;
  size_type *psVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pSVar13;
  long lVar14;
  size_t __n;
  int local_f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  RenderPerformanceTestBase::init(&this->super_RenderPerformanceTestBase,ctx);
  pRVar5 = Context::getRenderTarget
                     ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  if (0x7f < pRVar5->m_width) {
    pRVar5 = Context::getRenderTarget
                       ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
    if (0x7f < pRVar5->m_height) {
      lVar14 = 0;
      (**(code **)(lVar10 + 0x1a00))(0,0,0x80,0x80);
      (**(code **)(lVar10 + 0x120))(0x302,0x303);
      (**(code **)(lVar10 + 0x100))(0x8006);
      (**(code **)(lVar10 + 0x5e0))(0xbe2);
      pSVar13 = (this->m_results).
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pSVar13 ==
            (this->m_results).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          __src = (this->m_results).
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          __n = (long)pSVar13 - (long)__src;
          if (__n == 0x7fffffffffffffd0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar10 = (long)__n >> 4;
          uVar11 = lVar10 * -0x3333333333333333;
          uVar6 = 1;
          if (pSVar13 != __src) {
            uVar6 = uVar11;
          }
          uVar8 = uVar6 + uVar11;
          if (0x199999999999998 < uVar8) {
            uVar8 = 0x199999999999999;
          }
          uVar12 = 0x199999999999999;
          if (!CARRY8(uVar6,uVar11)) {
            uVar12 = uVar8;
          }
          if (uVar12 == 0) {
            __dest = (pointer)0x0;
          }
          else {
            __dest = (pointer)operator_new(uVar12 * 0x50);
          }
          pdVar2 = &(__dest->result).duration.renderReadDuration + lVar10 * 2;
          *pdVar2 = 0;
          pdVar2[1] = 0;
          pdVar2 = &(__dest->result).duration.readDuration + lVar10 * 2;
          *pdVar2 = 0;
          pdVar2[1] = 0;
          pdVar2 = &(__dest->result).duration.uploadDuration + lVar10 * 2;
          *pdVar2 = 0;
          pdVar2[1] = 0;
          piVar3 = &(__dest->result).uploadedDataSize + lVar10 * 4;
          *(undefined8 *)piVar3 = 0;
          *(undefined8 *)(piVar3 + 2) = 0;
          puVar1 = (undefined8 *)((long)&__dest->scene + lVar10 * 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          if (0 < (long)__n) {
            memmove(__dest,__src,__n);
          }
          if (__src != (pointer)0x0) {
            operator_delete(__src,(long)(this->m_results).
                                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__src);
          }
          pSVar13 = (pointer)((long)__dest + __n + 0x50);
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_start = __dest;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar13;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar12;
        }
        else {
          (pSVar13->result).duration.renderReadDuration = 0;
          (pSVar13->result).duration.fitResponseDuration = 0;
          (pSVar13->result).duration.readDuration = 0;
          (pSVar13->result).duration.totalDuration = 0;
          (pSVar13->result).duration.uploadDuration = 0;
          (pSVar13->result).duration.renderDuration = 0;
          (pSVar13->result).uploadedDataSize = 0;
          (pSVar13->result).renderDataSize = 0;
          (pSVar13->result).unrelatedDataSize = 0;
          (pSVar13->result).numVertices = 0;
          (pSVar13->scene).gridWidth = 0;
          (pSVar13->scene).gridHeight = 0;
          *(undefined8 *)&(pSVar13->scene).gridLayers = 0;
          pSVar13 = (this->m_results).
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar13;
        }
        iVar4 = *(int *)((long)&DAT_00b33390 + lVar14);
        pSVar13[-1].scene.gridHeight = iVar4;
        pSVar13[-1].scene.gridWidth = iVar4;
        pSVar13[-1].scene.gridLayers = 5;
        pSVar13[-1].result.numVertices = iVar4 * iVar4 * 0x1e;
        pSVar13[-1].result.uploadedDataSize = -1;
        pSVar13[-1].result.renderDataSize = -1;
        pSVar13[-1].result.unrelatedDataSize = -1;
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0x4c);
      std::vector<int,_std::allocator<int>_>::resize
                (&this->m_iterationOrder,
                 ((long)pSVar13 -
                  (long)(this->m_results).
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
      generateTwoPassRandomIterationOrder
                (&this->m_iterationOrder,
                 (int)((ulong)((long)(this->m_iterationOrder).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->m_iterationOrder).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2));
      return extraout_EAX;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_f8[1] = 0x80;
  de::toString<int>(&local_d0,local_f8 + 1);
  std::operator+(&local_70,"Test case requires ",&local_d0);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_f0._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar9) {
    local_f0.field_2._M_allocated_capacity = *psVar9;
    local_f0.field_2._8_8_ = plVar7[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar9;
  }
  local_f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_f8[0] = 0x80;
  de::toString<int>(&local_90,local_f8);
  std::operator+(&local_50,&local_f0,&local_90);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar9) {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0.field_2._8_8_ = plVar7[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar9;
  }
  local_b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(this_00,&local_b0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RenderCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	RenderPerformanceTestBase::init();

	// requirements

	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test case requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " render target");

	// gl state

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);

	// enable bleding to prevent grid layers from being discarded
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl.blendEquation(GL_FUNC_ADD);
	gl.enable(GL_BLEND);

	// generate iterations

	{
		const int gridSizes[] = { 20, 26, 32, 38, 44, 50, 56, 62, 68, 74, 80,  86,  92,  98,  104, 110, 116, 122, 128 };

		for (int gridNdx = 0; gridNdx < DE_LENGTH_OF_ARRAY(gridSizes); ++gridNdx)
		{
			m_results.push_back(SampleResult());

			m_results.back().scene.gridHeight = gridSizes[gridNdx];
			m_results.back().scene.gridWidth = gridSizes[gridNdx];
			m_results.back().scene.gridLayers = 5;

			m_results.back().result.numVertices = getLayeredGridNumVertices(m_results.back().scene);

			// test cases set these, initialize to dummy values
			m_results.back().result.renderDataSize = -1;
			m_results.back().result.uploadedDataSize = -1;
			m_results.back().result.unrelatedDataSize = -1;
		}
	}

	// randomize iteration order
	{
		m_iterationOrder.resize(m_results.size());
		generateTwoPassRandomIterationOrder(m_iterationOrder, (int)m_iterationOrder.size());
	}
}